

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# framing.c
# Opt level: O2

char * ogg_sync_buffer(ogg_sync_state *oy,long size)

{
  int iVar1;
  int iVar2;
  uchar *puVar3;
  uint uVar4;
  int iVar5;
  size_t __size;
  
  iVar2 = oy->storage;
  if (iVar2 < 0) {
    return (char *)0x0;
  }
  iVar5 = oy->returned;
  if ((long)iVar5 != 0) {
    iVar1 = oy->fill;
    uVar4 = iVar1 - iVar5;
    oy->fill = uVar4;
    if (uVar4 != 0 && iVar5 <= iVar1) {
      memmove(oy->data,oy->data + iVar5,(ulong)uVar4);
      iVar2 = oy->storage;
    }
    oy->returned = 0;
  }
  iVar5 = oy->fill;
  if (iVar2 - iVar5 < size) {
    if (size <= 0x7fffefff - (long)iVar5) {
      __size = size + iVar5 + 0x1000;
      if (oy->data == (uchar *)0x0) {
        puVar3 = (uchar *)malloc(__size);
      }
      else {
        puVar3 = (uchar *)realloc(oy->data,__size);
      }
      if (puVar3 != (uchar *)0x0) {
        oy->data = puVar3;
        oy->storage = (int)__size;
        iVar5 = oy->fill;
        goto LAB_001c5029;
      }
    }
    ogg_sync_clear(oy);
    puVar3 = (uchar *)0x0;
  }
  else {
    puVar3 = oy->data;
LAB_001c5029:
    puVar3 = puVar3 + iVar5;
  }
  return (char *)puVar3;
}

Assistant:

char *ogg_sync_buffer(ogg_sync_state *oy, long size){
  if(ogg_sync_check(oy)) return NULL;

  /* first, clear out any space that has been previously returned */
  if(oy->returned){
    oy->fill-=oy->returned;
    if(oy->fill>0)
      memmove(oy->data,oy->data+oy->returned,oy->fill);
    oy->returned=0;
  }

  if(size>oy->storage-oy->fill){
    /* We need to extend the internal buffer */
    long newsize;
    void *ret;

    if(size>INT_MAX-4096-oy->fill){
      ogg_sync_clear(oy);
      return NULL;
    }
    newsize=size+oy->fill+4096; /* an extra page to be nice */
    if(oy->data)
      ret=_ogg_realloc(oy->data,newsize);
    else
      ret=_ogg_malloc(newsize);
    if(!ret){
      ogg_sync_clear(oy);
      return NULL;
    }
    oy->data=ret;
    oy->storage=newsize;
  }

  /* expose a segment at least as large as requested at the fill mark */
  return((char *)oy->data+oy->fill);
}